

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputTextMessageContent.h
# Opt level: O2

void __thiscall
TgBot::InputTextMessageContent::InputTextMessageContent(InputTextMessageContent *this)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"InputTextMessageContent",&local_31);
  InputMessageContent::InputMessageContent(&this->super_InputMessageContent,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_InputMessageContent)._vptr_InputMessageContent =
       (_func_int **)&PTR__InputTextMessageContent_002cf8d0;
  (this->messageText)._M_dataplus._M_p = (pointer)&(this->messageText).field_2;
  (this->messageText)._M_string_length = 0;
  (this->messageText).field_2._M_local_buf[0] = '\0';
  (this->parseMode)._M_dataplus._M_p = (pointer)&(this->parseMode).field_2;
  (this->parseMode)._M_string_length = 0;
  (this->parseMode).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

InputTextMessageContent():
        InputMessageContent("InputTextMessageContent")
    {}